

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  char **ppcVar6;
  char *pcVar7;
  
  lVar2 = -(long)ptr;
  do {
    pcVar3 = end + lVar2;
    if ((long)pcVar3 < 1) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    ppcVar6 = (char **)(ulong)bVar1;
    if (ppcVar6 < (char **)0xe) {
      pcVar7 = (char *)((long)&switchD_00487778::switchdataD_0058e03c +
                       (long)(int)(&switchD_00487778::switchdataD_0058e03c)[(long)ppcVar6]);
      switch(ppcVar6) {
      case (char **)0x0:
      case (char **)0x1:
      case (char **)0x8:
switchD_00487778_caseD_0:
        *nextTokPtr = ptr;
        return 0;
      default:
        goto switchD_00487778_caseD_2;
      case (char **)0x5:
        if (pcVar3 == (char *)0x1) {
          return -2;
        }
        iVar4 = (*enc[3].literalScanners[1])(enc,ptr,pcVar7,ppcVar6);
        if (iVar4 != 0) goto switchD_00487778_caseD_0;
        ptr = (char *)((byte *)ptr + 2);
        break;
      case (char **)0x6:
        if (pcVar3 < (char *)0x3) {
          return -2;
        }
        iVar4 = (*enc[3].sameName)(enc,ptr,pcVar7);
        if (iVar4 != 0) goto switchD_00487778_caseD_0;
        ptr = (char *)((byte *)ptr + 3);
        break;
      case (char **)0x7:
        if (pcVar3 < (char *)0x4) {
          return -2;
        }
        iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar7,(char *)ppcVar6);
        if (iVar4 != 0) goto switchD_00487778_caseD_0;
        ptr = (char *)((byte *)ptr + 4);
        break;
      case (char **)0xc:
      case (char **)0xd:
        ptr = (char *)((byte *)ptr + 1);
        if ((uint)bVar1 == open) {
          if (end == ptr || (long)end - (long)ptr < 0) {
            return -0x1b;
          }
          *nextTokPtr = ptr;
          uVar5 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
          if (0x1e < uVar5) {
            return 0;
          }
          if ((0x40300e00U >> (uVar5 & 0x1f) & 1) == 0) {
            return 0;
          }
          return 0x1b;
        }
      }
    }
    else {
switchD_00487778_caseD_2:
      ptr = (char *)((byte *)ptr + 1);
    }
    lVar2 = -(long)ptr;
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc,
                const char *ptr, const char *end,
                const char **nextTokPtr)
{
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}